

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

SigningResult __thiscall
wallet::CWallet::SignMessage(CWallet *this,string *message,PKHash *pkhash,string *str_sig)

{
  bool bVar1;
  uint uVar2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *this_00;
  reference mutexIn;
  pointer pSVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>
  *spk_man_pair;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *__range1;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  CScript script_pub_key;
  SignatureData sigdata;
  SignatureData *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb64;
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  *in_stack_fffffffffffffb68;
  char *pszFile;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  SigningResult local_42c;
  SignatureData *in_stack_fffffffffffffbe8;
  char local_408 [80];
  undefined1 local_3b8 [32];
  undefined1 local_398 [912];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureData::SignatureData(in_stack_fffffffffffffbe8);
  pszFile = local_408;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PKHash_const&,void,void,PKHash,void>
            (in_stack_fffffffffffffb68,
             (PKHash *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffffb58);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffffb58);
  this_00 = (UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)(in_RDI + 0x170);
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::begin((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::end((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
         *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
  do {
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffb68,
                            (_Self *)CONCAT44(in_stack_fffffffffffffb64,in_stack_fffffffffffffb60));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_42c = PRIVATE_KEY_NOT_AVAILABLE;
LAB_001b541c:
      CScript::~CScript((CScript *)in_stack_fffffffffffffb58);
      SignatureData::~SignatureData(in_stack_fffffffffffffb58);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_42c;
      }
      __stack_chk_fail();
    }
    mutexIn = std::
              _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
              ::operator*((_Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                           *)in_stack_fffffffffffffb58);
    pSVar3 = std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
             ::operator->((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                           *)in_stack_fffffffffffffb58);
    uVar2 = (*pSVar3->_vptr_ScriptPubKeyMan[0x16])(pSVar3,local_3b8,local_398);
    if ((uVar2 & 1) != 0) {
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffb58);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                (this_00,(AnnotatedMixin<std::recursive_mutex> *)mutexIn,
                 (char *)CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),pszFile,
                 (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
      pSVar3 = std::
               unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>::
               operator->((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                           *)in_stack_fffffffffffffb58);
      local_42c = (*pSVar3->_vptr_ScriptPubKeyMan[0x18])(pSVar3,in_RSI,in_RDX,in_RCX);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffb58);
      goto LAB_001b541c;
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                  *)in_stack_fffffffffffffb58);
  } while( true );
}

Assistant:

SigningResult CWallet::SignMessage(const std::string& message, const PKHash& pkhash, std::string& str_sig) const
{
    SignatureData sigdata;
    CScript script_pub_key = GetScriptForDestination(pkhash);
    for (const auto& spk_man_pair : m_spk_managers) {
        if (spk_man_pair.second->CanProvide(script_pub_key, sigdata)) {
            LOCK(cs_wallet);  // DescriptorScriptPubKeyMan calls IsLocked which can lock cs_wallet in a deadlocking order
            return spk_man_pair.second->SignMessage(message, pkhash, str_sig);
        }
    }
    return SigningResult::PRIVATE_KEY_NOT_AVAILABLE;
}